

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

int exr_set_display_window(exr_context_t ctxt,int part_index,exr_attr_box2i_t *dw)

{
  long lVar1;
  long lVar2;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *paVar3;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 aVar4;
  int iVar5;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar6;
  
  if (dw == (exr_attr_box2i_t *)0x0) {
    iVar5 = (**(code **)(ctxt + 0x40))(ctxt,3,"Missing value for data window assignment");
    return iVar5;
  }
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    iVar5 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return iVar5;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar6 = 0x15;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x0) {
      lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      lVar2 = *(long *)(lVar1 + 0x38);
      if (lVar2 == 0) {
        iVar5 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)(lVar1 + 8),"displayWindow",
                                  EXR_ATTR_BOX2I,0,(uint8_t **)0x0,
                                  (exr_attribute_t **)(lVar1 + 0x38));
      }
      else {
        iVar5 = 0;
        if (*(int *)(lVar2 + 0x14) != 1) {
          iVar5 = (**(code **)(ctxt + 0x48))
                            (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                             *(undefined8 *)(lVar2 + 8),"displayWindow",*(code **)(ctxt + 0x48));
          return iVar5;
        }
      }
      if (iVar5 != 0) {
        return iVar5;
      }
      paVar3 = *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 **)(*(long *)(lVar1 + 0x38) + 0x18);
      aVar4 = (dw->max).field_0;
      *paVar3 = (dw->min).field_0;
      paVar3[1] = aVar4;
      aVar4 = (dw->max).field_0;
      *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)(lVar1 + 0xa0) = (dw->min).field_0;
      *(anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)(lVar1 + 0xa8) = aVar4;
      return 0;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar6 = 8;
  }
  iVar5 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar6);
  return iVar5;
}

Assistant:

exr_result_t
exr_set_display_window (
    exr_context_t ctxt, int part_index, const exr_attr_box2i_t* dw)
{
    if (!dw)
        return EXR_CTXT (ctxt)->report_error (
            EXR_CTXT (ctxt),
            EXR_ERR_INVALID_ARGUMENT,
            "Missing value for data window assignment");

    REQ_ATTR_FIND_CREATE (displayWindow, EXR_ATTR_BOX2I);
    if (rv == EXR_ERR_SUCCESS)
    {
        *(attr->box2i)       = *dw;
        part->display_window = *dw;
    }

    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}